

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

group * __thiscall
clipp::in_sequence<clipp::parameter,clipp::parameter>
          (group *__return_storage_ptr__,clipp *this,parameter *param,parameter *params)

{
  clipp *pcVar1;
  vector<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_> *pvVar2;
  ulong uVar3;
  pointer pfVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  _Manager_type p_Var20;
  pointer pcVar21;
  undefined1 auVar22 [32];
  vector<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  *pvVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  _Any_data _Var32;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined2 local_238;
  undefined1 local_230 [64];
  undefined1 local_1f0 [64];
  pointer local_1b0;
  pointer pbStack_1a8;
  _Any_data local_1a0;
  _Manager_type local_190;
  _Invoker_type local_188;
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined2 local_160;
  undefined1 local_158 [104];
  undefined1 local_f0 [64];
  pointer local_b0;
  pointer pbStack_a8;
  _Any_data local_a0;
  _Manager_type local_90;
  _Invoker_type local_88;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined2 local_60;
  group local_58;
  undefined1 auVar28 [64];
  
  local_258._0_8_ = local_258 + 0x10;
  this[0x21] = (clipp)0x1;
  (param->super_token<clipp::parameter>).blocking_ = true;
  pcVar1 = this + 0x10;
  if (*(clipp **)this == pcVar1) {
    local_248._M_allocated_capacity = *(undefined8 *)pcVar1;
    local_248._8_8_ = *(undefined8 *)(this + 0x18);
  }
  else {
    local_248._M_allocated_capacity = *(undefined8 *)pcVar1;
    local_258._0_8_ = *(clipp **)this;
  }
  local_258._8_8_ = *(undefined8 *)(this + 8);
  auVar26 = vpmovsxbq_avx512f(ZEXT816(0x908020100));
  *(clipp **)this = pcVar1;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (clipp)0x0;
  local_238 = *(undefined2 *)(this + 0x20);
  auVar5 = *(undefined1 (*) [16])(this + 0x28);
  auVar6 = *(undefined1 (*) [16])(this + 0x40);
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(this + 0x38);
  auVar27 = vpbroadcastq_avx512f(auVar12);
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  auVar27 = vpermt2q_avx512f(ZEXT2464(CONCAT816(auVar27._16_8_,auVar5)),auVar26,ZEXT1664(auVar6));
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(this + 0x50);
  auVar28 = vpbroadcastq_avx512f(auVar5);
  auVar29._0_40_ = auVar27._0_40_;
  auVar29._40_8_ = auVar28._40_8_;
  auVar29._48_8_ = auVar27._48_8_;
  auVar29._56_8_ = auVar27._56_8_;
  *(undefined8 *)(this + 0x50) = 0;
  auVar27 = vinserti32x4_avx512f(auVar29,*(undefined1 (*) [16])(this + 0x58),3);
  local_230 = vmovdqu64_avx512f(auVar27);
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  uVar3 = *(ulong *)(this + 0x68);
  *(undefined8 *)(this + 0x68) = 0;
  auVar5 = *(undefined1 (*) [16])(this + 0x70);
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined8 *)(this + 0x78) = 0;
  auVar22 = vpermq_avx2(ZEXT1632(auVar5),0xd0);
  auVar22 = vpblendd_avx2(auVar22,ZEXT832(uVar3),3);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(this + 0x80);
  auVar27 = vpbroadcastq_avx512f(auVar6);
  *(undefined8 *)(this + 0x80) = 0;
  auVar27 = vinserti32x4_avx512f
                      (ZEXT3264(CONCAT824(auVar27._24_8_,auVar22._0_24_)),
                       *(undefined1 (*) [16])(this + 0x88),2);
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(this + 0x98);
  auVar28 = vpbroadcastq_avx512f(auVar13);
  auVar30._48_8_ = auVar28._48_8_;
  *(undefined8 *)(this + 0x98) = 0;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(this + 0xa0);
  auVar28 = vpbroadcastq_avx512f(auVar14);
  auVar30._0_48_ = auVar27._0_48_;
  auVar30._56_8_ = auVar28._56_8_;
  local_1f0 = vmovdqu64_avx512f(auVar30);
  local_1b0 = *(pointer *)(this + 0xa8);
  pbStack_1a8 = *(pointer *)(this + 0xb0);
  *(undefined8 *)(this + 0xb0) = 0;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0xa8) = 0;
  local_190 = (_Manager_type)0x0;
  local_1a0._M_unused._M_object = (void *)0x0;
  local_1a0._8_8_ = 0;
  local_188 = *(_Invoker_type *)(this + 0xd0);
  p_Var20 = *(_Manager_type *)(this + 200);
  if (p_Var20 != (_Manager_type)0x0) {
    local_1a0._M_unused._0_8_ = (undefined8)*(undefined8 *)(this + 0xb8);
    local_1a0._8_8_ = *(undefined8 *)(this + 0xc0);
    *(undefined8 *)(this + 200) = 0;
    *(undefined8 *)(this + 0xd0) = 0;
    local_190 = p_Var20;
  }
  local_180._M_p = (pointer)&local_170;
  paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(this + 0xe8);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)(this + 0xd8) == paVar24) {
    local_170._M_allocated_capacity = paVar24->_M_allocated_capacity;
    local_170._8_8_ = *(undefined8 *)(this + 0xf0);
  }
  else {
    local_170._M_allocated_capacity = paVar24->_M_allocated_capacity;
    local_180._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(this + 0xd8);
  }
  local_178 = *(size_type *)(this + 0xe0);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)(this + 0xd8) = paVar24;
  *(undefined8 *)(this + 0xe0) = 0;
  this[0xe8] = (clipp)0x0;
  local_158._0_8_ = local_158 + 0x10;
  local_160 = *(undefined2 *)(this + 0xf8);
  paVar24 = &(param->super_token<clipp::parameter>).doc_.field_2;
  pcVar21 = (param->super_token<clipp::parameter>).doc_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar21 == paVar24) {
    local_158._16_8_ = paVar24->_M_allocated_capacity;
    local_158._24_8_ =
         *(undefined8 *)((long)&(param->super_token<clipp::parameter>).doc_.field_2 + 8);
  }
  else {
    local_158._16_8_ = paVar24->_M_allocated_capacity;
    local_158._0_8_ = pcVar21;
  }
  local_158._8_8_ = (param->super_token<clipp::parameter>).doc_._M_string_length;
  _Var32 = (_Any_data)(ZEXT816(0) << 0x20);
  (param->super_token<clipp::parameter>).doc_._M_dataplus._M_p = (pointer)paVar24;
  (param->super_token<clipp::parameter>).doc_._M_string_length = 0;
  (param->super_token<clipp::parameter>).doc_.field_2._M_local_buf[0] = '\0';
  local_158[0x20] = (param->super_token<clipp::parameter>).repeatable_;
  local_158[0x21] = (param->super_token<clipp::parameter>).blocking_;
  pvVar23 = &(param->super_action_provider<clipp::parameter>).argActions_;
  auVar7._0_8_ = (pvVar23->
                 super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  auVar7._8_8_ = (pvVar23->
                 super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = &(param->super_action_provider<clipp::parameter>).repeatActions_;
  auVar8._0_8_ = (pvVar2->
                 super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  auVar8._8_8_ = (pvVar2->
                 super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
  *(_Any_data *)
   &(param->super_action_provider<clipp::parameter>).argActions_.
    super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
    ._M_impl.super__Vector_impl_data = _Var32;
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (param->super_action_provider<clipp::parameter>).argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar27 = vpbroadcastq_avx512f(auVar15);
  (param->super_action_provider<clipp::parameter>).argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(_Any_data *)
   &(param->super_action_provider<clipp::parameter>).repeatActions_.
    super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
    _M_impl.super__Vector_impl_data = _Var32;
  auVar26 = vpermt2q_avx512f(ZEXT2464(CONCAT816(auVar27._16_8_,auVar7)),auVar26,ZEXT1664(auVar8));
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (param->super_action_provider<clipp::parameter>).repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar27 = vpbroadcastq_avx512f(auVar16);
  auVar28._0_40_ = auVar26._0_40_;
  auVar28._40_8_ = auVar27._40_8_;
  auVar28._48_8_ = auVar26._48_8_;
  auVar28._56_8_ = auVar26._56_8_;
  (param->super_action_provider<clipp::parameter>).repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = &(param->super_action_provider<clipp::parameter>).missingActions_;
  auVar9._0_8_ = (pvVar2->
                 super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  auVar9._8_8_ = (pvVar2->
                 super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
  auVar26 = vinserti32x4_avx512f(auVar28,auVar9,3);
  local_158._40_64_ = vmovdqu64_avx512f(auVar26);
  *(_Any_data *)
   &(param->super_action_provider<clipp::parameter>).missingActions_.
    super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
    _M_impl.super__Vector_impl_data = _Var32;
  pfVar4 = (param->super_action_provider<clipp::parameter>).missingActions_.
           super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param->super_action_provider<clipp::parameter>).missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = &(param->super_action_provider<clipp::parameter>).blockedActions_;
  auVar10._0_8_ =
       (pvVar2->
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  auVar10._8_8_ =
       (pvVar2->
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  *(_Any_data *)
   &(param->super_action_provider<clipp::parameter>).blockedActions_.
    super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
    _M_impl.super__Vector_impl_data = _Var32;
  auVar22 = vpermq_avx2(ZEXT1632(auVar10),0xd0);
  auVar22 = vpblendd_avx2(auVar22,ZEXT832(pfVar4),3);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (param->super_action_provider<clipp::parameter>).blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar26 = vpbroadcastq_avx512f(auVar17);
  (param->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = &(param->super_action_provider<clipp::parameter>).conflictActions_;
  auVar11._0_8_ =
       (pvVar2->
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  auVar11._8_8_ =
       (pvVar2->
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  auVar26 = vinserti32x4_avx512f(ZEXT3264(CONCAT824(auVar26._24_8_,auVar22._0_24_)),auVar11,2);
  *(_Any_data *)
   &(param->super_action_provider<clipp::parameter>).conflictActions_.
    super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
    _M_impl.super__Vector_impl_data = _Var32;
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (param->super_action_provider<clipp::parameter>).conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar27 = vpbroadcastq_avx512f(auVar18);
  auVar31._48_8_ = auVar27._48_8_;
  (param->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (param->flags_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar27 = vpbroadcastq_avx512f(auVar19);
  auVar31._0_48_ = auVar26._0_48_;
  auVar31._56_8_ = auVar27._56_8_;
  local_f0 = vmovdqu64_avx512f(auVar31);
  local_b0 = (param->flags_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pbStack_a8 = (param->flags_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(_Any_data *)
   &(param->flags_).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data = _Var32;
  local_90 = (_Manager_type)0x0;
  local_88 = (param->matcher_)._M_invoker;
  p_Var20 = (param->matcher_).super__Function_base._M_manager;
  local_a0 = _Var32;
  if (p_Var20 != (_Manager_type)0x0) {
    local_a0 = (param->matcher_).super__Function_base._M_functor;
    *(_Any_data *)&(param->matcher_).super__Function_base._M_manager = _Var32;
    local_90 = p_Var20;
  }
  local_80._M_p = (pointer)&local_70;
  paVar25 = &(param->label_).field_2;
  paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(param->label_)._M_dataplus._M_p;
  if (paVar24 == paVar25) {
    local_70._M_allocated_capacity = paVar25->_M_allocated_capacity;
    local_70._8_8_ = *(undefined8 *)((long)&(param->label_).field_2 + 8);
  }
  else {
    local_70._M_allocated_capacity = paVar25->_M_allocated_capacity;
    local_80._M_p = (pointer)paVar24;
  }
  local_78 = (param->label_)._M_string_length;
  (param->label_)._M_dataplus._M_p = (pointer)paVar25;
  (param->label_)._M_string_length = 0;
  (param->label_).field_2._M_local_buf[0] = '\0';
  local_60._0_1_ = param->required_;
  local_60._1_1_ = param->greedy_;
  group::group<clipp::parameter>(&local_58,(parameter *)local_258,(parameter *)local_158);
  local_58.scoped_ = true;
  group::group(__return_storage_ptr__,&local_58);
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_58.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_58.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_58.super_token<clipp::group>.doc_._M_dataplus._M_p);
  }
  parameter::~parameter((parameter *)local_158);
  parameter::~parameter((parameter *)local_258);
  return __return_storage_ptr__;
}

Assistant:

inline group
in_sequence(Param param, Params... params)
{
    detail::set_blocking(true, param, params...);
    return group{std::move(param), std::move(params)...}.scoped(true);
}